

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t
psa_tls12_prf_input(psa_tls12_prf_key_derivation_t *prf,psa_algorithm_t hash_alg,
                   psa_key_derivation_step_t step,uint8_t *data,size_t data_length)

{
  psa_status_t pVar1;
  uint8_t *puVar2;
  int iVar3;
  undefined6 in_register_00000012;
  
  iVar3 = (int)CONCAT62(in_register_00000012,step);
  if (iVar3 == 0x101) {
    pVar1 = psa_tls12_prf_set_key(prf,hash_alg,data,data_length);
    return pVar1;
  }
  if (iVar3 == 0x201) {
    if (prf->state != TLS12_PRF_STATE_KEY_SET) {
      return -0x89;
    }
    if (data_length != 0) {
      puVar2 = (uint8_t *)calloc(1,data_length);
      prf->label = puVar2;
      if (puVar2 == (uint8_t *)0x0) {
        return -0x8d;
      }
      memcpy(puVar2,data,data_length);
      prf->label_length = data_length;
    }
    prf->state = TLS12_PRF_STATE_LABEL_SET;
  }
  else {
    if (iVar3 != 0x204) {
      return -0x87;
    }
    if (prf->state != TLS12_PRF_STATE_INIT) {
      return -0x89;
    }
    if (data_length != 0) {
      puVar2 = (uint8_t *)calloc(1,data_length);
      prf->seed = puVar2;
      if (puVar2 == (uint8_t *)0x0) {
        return -0x8d;
      }
      memcpy(puVar2,data,data_length);
      prf->seed_length = data_length;
    }
    prf->state = TLS12_PRF_STATE_SEED_SET;
  }
  return 0;
}

Assistant:

static psa_status_t psa_tls12_prf_input( psa_tls12_prf_key_derivation_t *prf,
                                         psa_algorithm_t hash_alg,
                                         psa_key_derivation_step_t step,
                                         const uint8_t *data,
                                         size_t data_length )
{
    switch( step )
    {
        case PSA_KEY_DERIVATION_INPUT_SEED:
            return( psa_tls12_prf_set_seed( prf, data, data_length ) );
        case PSA_KEY_DERIVATION_INPUT_SECRET:
            return( psa_tls12_prf_set_key( prf, hash_alg, data, data_length ) );
        case PSA_KEY_DERIVATION_INPUT_LABEL:
            return( psa_tls12_prf_set_label( prf, data, data_length ) );
        default:
            return( PSA_ERROR_INVALID_ARGUMENT );
    }
}